

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void explainAppendTerm(StrAccum *pStr,Index *pIdx,int nTerm,int iTerm,int bAnd,char *zOp)

{
  char *z;
  int iVar1;
  int iVar2;
  
  if (bAnd != 0) {
    sqlite3_str_append(pStr," AND ",5);
  }
  if (1 < nTerm) {
    sqlite3_str_append(pStr,"(",1);
  }
  iVar2 = 0;
  iVar1 = 0;
  if (0 < nTerm) {
    iVar1 = nTerm;
  }
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    if (iVar2 != 0) {
      sqlite3_str_append(pStr,",",1);
    }
    z = explainIndexColumnName(pIdx,iTerm + iVar2);
    sqlite3_str_appendall(pStr,z);
  }
  if (1 < nTerm) {
    sqlite3_str_append(pStr,")",1);
    sqlite3_str_append(pStr,zOp,1);
    zOp = "(";
  }
  sqlite3_str_append(pStr,zOp,1);
  for (iVar2 = 0; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    if (iVar2 != 0) {
      sqlite3_str_append(pStr,",",1);
    }
    sqlite3_str_append(pStr,"?",1);
  }
  if (nTerm < 2) {
    return;
  }
  sqlite3_str_append(pStr,")",1);
  return;
}

Assistant:

static void explainAppendTerm(
  StrAccum *pStr,             /* The text expression being built */
  Index *pIdx,                /* Index to read column names from */
  int nTerm,                  /* Number of terms */
  int iTerm,                  /* Zero-based index of first term. */
  int bAnd,                   /* Non-zero to append " AND " */
  const char *zOp             /* Name of the operator */
){
  int i;

  assert( nTerm>=1 );
  if( bAnd ) sqlite3_str_append(pStr, " AND ", 5);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_appendall(pStr, explainIndexColumnName(pIdx, iTerm+i));
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);

  sqlite3_str_append(pStr, zOp, 1);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_append(pStr, "?", 1);
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);
}